

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O1

bool __thiscall
acto::actor_ref::send_message
          (actor_ref *this,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  object_t *poVar1;
  runtime_t *this_00;
  ssize_t sVar2;
  pointer *__ptr;
  int in_R8D;
  _Head_base<0UL,_acto::core::msg_t_*,_false> local_18;
  
  this_00 = core::runtime_t::instance();
  poVar1 = this->object_;
  local_18._M_head_impl =
       (msg->_M_t).super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
       ._M_t.super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
       super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl;
  (msg->_M_t).super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
  .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
  super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl = (msg_t *)0x0;
  sVar2 = core::runtime_t::send(this_00,(int)poVar1,&local_18,(size_t)local_18._M_head_impl,in_R8D);
  if (local_18._M_head_impl != (msg_t *)0x0) {
    (*(local_18._M_head_impl)->_vptr_msg_t[1])();
  }
  return (bool)(char)sVar2;
}

Assistant:

bool actor_ref::send_message(std::unique_ptr<core::msg_t> msg) const {
  return core::runtime_t::instance()->send(object_, std::move(msg));
}